

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to16.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to16_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  uint _w;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  undefined4 *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 *puVar12;
  Mat local_70;
  
  _w = kernel_w * kernel_h;
  uVar10 = 0;
  Mat::reshape(&local_70,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 0x10,inch,outch / 0x10,4,(Allocator *)0x0);
  sVar1 = kernel_tm->cstep;
  sVar2 = kernel_tm->elemsize;
  pvVar3 = kernel_tm->data;
  uVar4 = (ulong)_w;
  if ((int)_w < 1) {
    uVar4 = uVar10;
  }
  uVar11 = (ulong)(uint)inch;
  if (inch < 1) {
    uVar11 = uVar10;
  }
  for (; (long)(uVar10 | 0xf) < (long)outch; uVar10 = uVar10 + 0x10) {
    pvVar5 = (void *)((uVar10 >> 4) * sVar1 * sVar2 + (long)pvVar3);
    for (uVar6 = 0; uVar6 != uVar11; uVar6 = uVar6 + 1) {
      puVar7 = (undefined4 *)
               (((long)local_70.w * uVar6 + uVar10 * local_70.cstep) * local_70.elemsize +
               (long)local_70.data);
      for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
        puVar12 = puVar7;
        for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 4) {
          *(undefined4 *)((long)pvVar5 + lVar9) = *puVar12;
          puVar12 = (undefined4 *)((long)puVar12 + local_70.cstep * local_70.elemsize);
        }
        puVar7 = puVar7 + 1;
        pvVar5 = (void *)((long)pvVar5 + 0x40);
      }
    }
  }
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount == 0) {
      if (local_70.allocator == (Allocator *)0x0) {
        free(local_70.data);
      }
      else {
        (*(local_70.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-maxk-inch-outch/16b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * maxk, inch, outch / 16);

    for (int q = 0; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 16; j++)
                {
                    const float* k00 = kernel.channel(q + j).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
}